

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

size_t __thiscall RPCHelpMan::GetParamIndex(RPCHelpMan *this,string_view key)

{
  RPCArg *pRVar1;
  bool bVar2;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> _Var3;
  long lVar4;
  __normal_iterator<const_RPCArg_*,_std::vector<RPCArg,_std::allocator<RPCArg>_>_> __it;
  long lVar5;
  long in_FS_OFFSET;
  size_t local_50;
  char *local_48;
  size_t *local_40;
  long local_38;
  
  local_48 = key._M_str;
  local_50 = key._M_len;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_40 = &local_50;
  __it._M_current =
       (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
       super__Vector_impl_data._M_start;
  pRVar1 = (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar5 = (long)pRVar1 - (long)__it._M_current;
  for (lVar4 = lVar5 / 0x108 >> 2; _Var3._M_current = __it._M_current, 0 < lVar4; lVar4 = lVar4 + -1
      ) {
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
            ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                          *)&local_40,__it);
    if (bVar2) goto LAB_005a5f4f;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
            ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                          *)&local_40,__it._M_current + 1);
    _Var3._M_current = __it._M_current + 1;
    if (bVar2) goto LAB_005a5f4f;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
            ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                          *)&local_40,__it._M_current + 2);
    _Var3._M_current = __it._M_current + 2;
    if (bVar2) goto LAB_005a5f4f;
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
            ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                          *)&local_40,__it._M_current + 3);
    _Var3._M_current = __it._M_current + 3;
    if (bVar2) goto LAB_005a5f4f;
    __it._M_current = __it._M_current + 4;
    lVar5 = lVar5 + -0x420;
  }
  lVar5 = lVar5 / 0x108;
  if (lVar5 != 1) {
    if (lVar5 != 2) {
      _Var3._M_current = pRVar1;
      if ((lVar5 != 3) ||
         (bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
                  ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                                *)&local_40,__it), _Var3._M_current = __it._M_current, bVar2))
      goto LAB_005a5f4f;
      _Var3._M_current = __it._M_current + 1;
    }
    bVar2 = __gnu_cxx::__ops::
            _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
            ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                          *)&local_40,_Var3);
    if (bVar2) goto LAB_005a5f4f;
    __it._M_current = _Var3._M_current + 1;
  }
  bVar2 = __gnu_cxx::__ops::
          _Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::$_0>
          ::operator()((_Iter_pred<RPCHelpMan::GetParamIndex(std::basic_string_view<char,std::char_traits<char>>)const::__0>
                        *)&local_40,__it);
  _Var3._M_current = pRVar1;
  if (bVar2) {
    _Var3._M_current = __it._M_current;
  }
LAB_005a5f4f:
  local_40 = (size_t *)
             CONCAT71(local_40._1_7_,
                      _Var3._M_current !=
                      (this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  inline_check_non_fatal<bool>
            ((bool *)&local_40,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/rpc/util.cpp"
             ,0x305,"GetParamIndex","it != m_args.end()");
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return ((long)_Var3._M_current -
         (long)(this->m_args).super__Vector_base<RPCArg,_std::allocator<RPCArg>_>._M_impl.
               super__Vector_impl_data._M_start) / 0x108;
}

Assistant:

size_t RPCHelpMan::GetParamIndex(std::string_view key) const
{
    auto it{std::find_if(
        m_args.begin(), m_args.end(), [&key](const auto& arg) { return arg.GetName() == key;}
    )};

    CHECK_NONFATAL(it != m_args.end());  // TODO: ideally this is checked at compile time
    return std::distance(m_args.begin(), it);
}